

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::RegisterCommand::~RegisterCommand(RegisterCommand *this)

{
  RegisterCommand *this_local;
  
  (this->super_CommandMixin<(wabt::CommandType)3>).super_Command._vptr_Command =
       (_func_int **)&PTR__RegisterCommand_002d84b0;
  Var::~Var(&this->var);
  std::__cxx11::string::~string((string *)&this->module_name);
  CommandMixin<(wabt::CommandType)3>::~CommandMixin(&this->super_CommandMixin<(wabt::CommandType)3>)
  ;
  return;
}

Assistant:

RegisterCommand(std::string_view module_name, const Var& var)
      : module_name(module_name), var(var) {}